

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O3

_Bool hd_anchor_eq(fy_accel *xl,void *hash,void *key1,void *key2,void *userdata)

{
  int iVar1;
  char *__s1;
  char *__s2;
  size_t len2;
  size_t len1;
  size_t local_20;
  size_t local_18;
  
  __s1 = fy_token_get_text((fy_token *)key1,&local_18);
  if (((__s1 != (char *)0x0) &&
      (__s2 = fy_token_get_text((fy_token *)key2,&local_20), __s2 != (char *)0x0)) &&
     (local_18 == local_20)) {
    iVar1 = bcmp(__s1,__s2,local_18);
    return iVar1 == 0;
  }
  return false;
}

Assistant:

static bool hd_anchor_eq(struct fy_accel *xl, const void *hash, const void *key1, const void *key2, void *userdata) {
    struct fy_token *fyt1 = (void *) key1, *fyt2 = (void *) key2;
    const char *text1, *text2;
    size_t len1, len2;

    text1 = fy_token_get_text(fyt1, &len1);
    if (!text1)
        return false;
    text2 = fy_token_get_text(fyt2, &len2);
    if (!text2)
        return false;

    return len1 == len2 && !memcmp(text1, text2, len1);
}